

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

int ncnn::from_gray2rgba(uchar *gray,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  int iVar1;
  long *in_R8;
  Mat alpha_channel;
  Mat rgb_channels;
  Mat *m_2;
  Mat *m_1;
  int i;
  float *ptr;
  int size;
  Allocator *in_stack_fffffffffffffd50;
  size_t in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  Mat *in_stack_fffffffffffffd70;
  bool local_271;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined4 local_258;
  long local_250;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined8 local_230;
  void *local_218;
  int *local_210;
  ulong local_208;
  undefined4 local_200;
  long *local_1f8;
  undefined4 local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  undefined4 local_1e0;
  ulong local_1d8;
  long *local_1c8;
  int local_1a4;
  undefined8 *local_1a0;
  void **local_198;
  undefined1 local_17d;
  undefined4 local_17c;
  undefined8 *local_170;
  long *local_160;
  long local_158;
  undefined4 local_14c;
  ulong local_148;
  Allocator *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int local_e4;
  undefined4 *local_e0;
  
  local_1c8 = in_R8;
  Mat::create(in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
              (int)in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
              in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  local_271 = true;
  if (*local_1c8 != 0) {
    local_160 = local_1c8;
    local_271 = local_1c8[8] * (long)(int)local_1c8[7] == 0;
  }
  if (local_271) {
    local_1a4 = -100;
  }
  else {
    local_1ec = *(int *)((long)local_1c8 + 0x2c);
    local_1e8 = (int)local_1c8[6];
    local_1e4 = *(int *)((long)local_1c8 + 0x34);
    local_218 = (void *)*local_1c8;
    local_208 = local_1c8[2];
    local_200 = (undefined4)local_1c8[3];
    local_1f8 = (long *)local_1c8[4];
    local_210 = (int *)0x0;
    local_1e0 = 3;
    local_1d8 = ((long)local_1ec * (long)local_1e8 * (long)local_1e4 * local_208 + 0xf &
                0xfffffffffffffff0) / local_208;
    local_1f0 = (undefined4)local_1c8[5];
    from_gray2rgb((uchar *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                  (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                  in_stack_fffffffffffffed4,
                  (Mat *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                  in_stack_fffffffffffffec0);
    local_170 = &local_270;
    iVar1 = *(int *)((long)local_1c8 + 0x34);
    local_148 = local_1c8[2];
    local_14c = (undefined4)local_1c8[3];
    local_158 = local_1c8[4];
    local_230._0_4_ =
         (int)(((long)*(int *)((long)local_1c8 + 0x2c) * (long)(int)local_1c8[6] * local_148 + 0xf &
               0xfffffffffffffff0) / local_148);
    if ((int)local_1c8[5] == 4) {
      local_230._0_4_ = *(int *)((long)local_1c8 + 0x2c) * (int)local_1c8[6];
    }
    local_e0 = (undefined4 *)(*local_1c8 + local_1c8[8] * 3 * local_1c8[2]);
    for (local_e4 = 0; local_e4 < (int)local_230 * iVar1; local_e4 = local_e4 + 1) {
      *local_e0 = 0x437f0000;
      local_e0 = local_e0 + 1;
    }
    local_1a0 = &local_270;
    local_17c = 3;
    local_17d = 1;
    local_1a4 = 0;
    local_270 = 0;
    local_260 = 0;
    local_258 = 0;
    local_248 = 0;
    local_244 = 0;
    local_240 = 0;
    local_23c = 0;
    local_238 = 0;
    local_230 = 0;
    local_268 = 0;
    local_198 = &local_218;
    if (local_210 != (int *)0x0) {
      LOCK();
      iVar1 = *local_210;
      *local_210 = *local_210 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        local_250 = local_158;
        if (local_1f8 == (long *)0x0) {
          if (local_218 != (void *)0x0) {
            free(local_218);
          }
        }
        else {
          (**(code **)(*local_1f8 + 0x18))(local_1f8,local_218);
        }
      }
    }
  }
  return local_1a4;
}

Assistant:

static int from_gray2rgba(const unsigned char* gray, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    m.create(w, h, 4, 4u, allocator);
    if (m.empty())
        return -100;

    Mat rgb_channels = m.channel_range(0, 3);
    from_gray2rgb(gray, w, h, stride, rgb_channels, allocator);

    Mat alpha_channel = m.channel(3);
    alpha_channel.fill(255.f);

    return 0;
}